

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_operator.cpp
# Opt level: O3

vector<duckdb::ColumnBinding,_true> *
duckdb::LogicalOperator::MapBindings
          (vector<duckdb::ColumnBinding,_true> *__return_storage_ptr__,
          vector<duckdb::ColumnBinding,_true> *bindings,vector<unsigned_long,_true> *projection_map)

{
  pointer *ppCVar1;
  pointer puVar2;
  pointer puVar3;
  size_type *psVar4;
  iterator __position;
  idx_t iVar5;
  const_reference __args;
  vector<duckdb::ColumnBinding,_true> *result_bindings;
  size_type *psVar6;
  
  puVar2 = (projection_map->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar3 = (projection_map->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar2 == puVar3) {
    ::std::vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>::vector
              (&__return_storage_ptr__->
                super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>,
               &bindings->
                super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>);
  }
  else {
    (__return_storage_ptr__->
    super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>).
    super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>).
    super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>).
    super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ::std::vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>::reserve
              (&__return_storage_ptr__->
                super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>,
               (long)puVar3 - (long)puVar2 >> 3);
    psVar4 = (projection_map->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (psVar6 = (projection_map->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start; psVar6 != psVar4; psVar6 = psVar6 + 1) {
      __args = vector<duckdb::ColumnBinding,_true>::operator[](bindings,*psVar6);
      __position._M_current =
           (__return_storage_ptr__->
           super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>).
           super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl
           .super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->
          super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>).
          super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<duckdb::ColumnBinding,std::allocator<duckdb::ColumnBinding>>::
        _M_realloc_insert<duckdb::ColumnBinding_const&>
                  ((vector<duckdb::ColumnBinding,std::allocator<duckdb::ColumnBinding>> *)
                   __return_storage_ptr__,__position,__args);
      }
      else {
        iVar5 = __args->column_index;
        (__position._M_current)->table_index = __args->table_index;
        (__position._M_current)->column_index = iVar5;
        ppCVar1 = &(__return_storage_ptr__->
                   super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>).
                   super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppCVar1 = *ppCVar1 + 1;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

vector<ColumnBinding> LogicalOperator::MapBindings(const vector<ColumnBinding> &bindings,
                                                   const vector<idx_t> &projection_map) {
	if (projection_map.empty()) {
		return bindings;
	} else {
		vector<ColumnBinding> result_bindings;
		result_bindings.reserve(projection_map.size());
		for (auto index : projection_map) {
			D_ASSERT(index < bindings.size());
			result_bindings.push_back(bindings[index]);
		}
		return result_bindings;
	}
}